

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

string * fs_drop_slash_abi_cxx11_(string *__return_storage_ptr__,string_view in)

{
  string_view path;
  _Bool _Var1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  __type local_d3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 local_b0 [2];
  undefined8 local_a0;
  undefined8 local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  byte local_79;
  size_t local_78;
  size_t sStack_70;
  string local_68;
  size_t local_38;
  char *local_30;
  undefined1 local_21;
  undefined1 auStack_20 [8];
  string_view in_local;
  string *s;
  
  local_30 = in._M_str;
  local_38 = in._M_len;
  local_21 = 0;
  auStack_20 = (undefined1  [8])local_38;
  in_local._M_len = (size_t)local_30;
  in_local._M_str = (char *)__return_storage_ptr__;
  fs_as_posix_abi_cxx11_(__return_storage_ptr__,in);
  while( true ) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (__return_storage_ptr__);
    bVar4 = false;
    if (1 < sVar2) {
      pcVar3 = (char *)std::__cxx11::string::back();
      bVar4 = *pcVar3 == '/';
    }
    if (!bVar4) break;
    std::__cxx11::string::pop_back();
  }
  local_79 = 0;
  _Var1 = fs_is_windows();
  local_d3 = false;
  if (_Var1) {
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
    local_d3 = false;
    if (!bVar4) {
      local_78 = (size_t)auStack_20;
      sStack_70 = in_local._M_len;
      path._M_str = (char *)in_local._M_len;
      path._M_len = (size_t)auStack_20;
      fs_root_name_abi_cxx11_(&local_68,path);
      local_79 = 1;
      local_d3 = std::operator==(__return_storage_ptr__,&local_68);
    }
  }
  if ((local_79 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (local_d3 != false) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_98 = std::__cxx11::string::begin();
  local_a0 = std::__cxx11::string::end();
  local_90 = std::
             unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,fs_drop_slash(std::basic_string_view<char,std::char_traits<char>>)::__0>
                       (local_98,local_a0);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_88,&local_90);
  local_b8._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_b0,&local_b8);
  std::__cxx11::string::erase(__return_storage_ptr__,local_88,local_b0[0]);
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_drop_slash(std::string_view in)
{
  // drop all trailing "/" and duplicated internal "/"
  std::string s = fs_as_posix(in);

  while(s.length() > 1 && s.back() == '/')
    s.pop_back();

  if (fs_is_windows() && !in.empty() && s == fs_root_name(in))
    s.append("/");

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed trailing slash: " << s << "\n";

  s.erase(std::unique(s.begin(), s.end(), [](char a, char b){ return a == '/' && b == '/'; }), s.end());

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed duplicated internal slashes: " << s << "\n";

  return s;
}